

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

shared_ptr<Type> __thiscall Rel::check(Rel *this,shared_ptr<Type> *p1,shared_ptr<Type> *p2)

{
  element_type *peVar1;
  element_type *peVar2;
  long *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  shared_ptr<Type> sVar6;
  
  peVar1 = (p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar3 = false;
  }
  else {
    auVar5 = __dynamic_cast(peVar1,&Type::typeinfo,&Array::typeinfo,0);
    p2 = auVar5._8_8_;
    bVar3 = auVar5._0_8_ != 0;
  }
  peVar2 = (element_type *)*in_RCX;
  if (peVar2 == (element_type *)0x0) {
    bVar4 = false;
  }
  else {
    auVar5 = __dynamic_cast(peVar2,&Type::typeinfo,&Array::typeinfo,0);
    p2 = auVar5._8_8_;
    bVar4 = auVar5._0_8_ != 0;
  }
  if (((bool)(bVar3 | bVar4)) || (peVar1 != peVar2)) {
    (this->super_Logical).super_Expr.super_Node._vptr_Node = (_func_int **)0x0;
    *(undefined8 *)&(this->super_Logical).super_Expr.super_Node.lexline = 0;
  }
  else {
    std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> *)this,
               &Type::Bool.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
    p2 = (shared_ptr<Type> *)extraout_RDX;
  }
  sVar6.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p2;
  sVar6.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Type>)sVar6.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Type> check(std::shared_ptr<Type> p1, std::shared_ptr<Type> p2) override {
		Array* arr_left = dynamic_cast<Array*>(p1.get());
		Array* arr_right = dynamic_cast<Array*>(p2.get());
		if (arr_left || arr_right) return nullptr;
		else if (p1 == p2) return Type::Bool;
		else return nullptr;
	}